

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O3

StringLocalizationInfo * __thiscall
icu_63::LocDataParser::parse(LocDataParser *this,UChar *_data,int32_t len)

{
  UErrorCode *pUVar1;
  UParseError *pUVar2;
  StringLocalizationInfo *pSVar3;
  
  pUVar1 = this->ec;
  if (*pUVar1 < U_ILLEGAL_ARGUMENT_ERROR) {
    pUVar2 = this->pe;
    pUVar2->line = 0;
    pUVar2->offset = -1;
    pUVar2->postContext[0] = L'\0';
    pUVar2->preContext[0] = L'\0';
    if (_data == (UChar *)0x0) {
      *pUVar1 = U_ILLEGAL_ARGUMENT_ERROR;
      return (StringLocalizationInfo *)0x0;
    }
    if (0 < len) {
      this->data = _data;
      this->e = _data + (uint)len;
      this->p = _data;
      this->ch = L'\xffff';
      pSVar3 = doParse(this);
      return pSVar3;
    }
    *pUVar1 = U_ILLEGAL_ARGUMENT_ERROR;
  }
  else if (_data == (UChar *)0x0) {
    return (StringLocalizationInfo *)0x0;
  }
  uprv_free_63(_data);
  return (StringLocalizationInfo *)0x0;
}

Assistant:

StringLocalizationInfo*
LocDataParser::parse(UChar* _data, int32_t len) {
    if (U_FAILURE(ec)) {
        if (_data) uprv_free(_data);
        return NULL;
    }

    pe.line = 0;
    pe.offset = -1;
    pe.postContext[0] = 0;
    pe.preContext[0] = 0;

    if (_data == NULL) {
        ec = U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }

    if (len <= 0) {
        ec = U_ILLEGAL_ARGUMENT_ERROR;
        uprv_free(_data);
        return NULL;
    }

    data = _data;
    e = data + len;
    p = _data;
    ch = 0xffff;

    return doParse();
}